

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_pipeline_layout
          (StateRecorder *this,VkPipelineLayout pipeline_layout,
          VkPipelineLayoutCreateInfo *create_info,Hash custom_hash)

{
  Impl *this_00;
  bool bVar1;
  WorkItem local_88;
  VkPipelineLayoutCreateInfo *local_68;
  VkPipelineLayoutCreateInfo *new_info;
  string local_58;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lock;
  Hash custom_hash_local;
  VkPipelineLayoutCreateInfo *create_info_local;
  VkPipelineLayout pipeline_layout_local;
  StateRecorder *this_local;
  
  lock._M_device = (mutex_type *)custom_hash;
  std::lock_guard<std::mutex>::lock_guard(&local_38,&this->impl->record_lock);
  if (create_info->pNext == (void *)0x0) {
    local_68 = (VkPipelineLayoutCreateInfo *)0x0;
    bVar1 = Impl::copy_pipeline_layout(this->impl,create_info,&this->impl->temp_allocator,&local_68)
    ;
    if (bVar1) {
      this_00 = this->impl;
      local_88.type = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      local_88.handle = api_object_cast<unsigned_long,VkPipelineLayout_T*>(pipeline_layout);
      local_88.create_info = local_68;
      local_88.custom_hash = (Hash)lock._M_device;
      Impl::push_work_locked(this_00,&local_88);
      new_info._0_4_ = 0;
    }
    else {
      Impl::push_unregister_locked<VkPipelineLayout_T*>
                (this->impl,VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,pipeline_layout);
      this_local._7_1_ = 0;
      new_info._0_4_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,"pNext in VkPipelineLayoutCreateInfo not supported.",
               (allocator *)((long)&new_info + 7));
    log_error_pnext_chain(&local_58,create_info->pNext);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)((long)&new_info + 7));
    Impl::push_unregister_locked<VkPipelineLayout_T*>
              (this->impl,VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,pipeline_layout);
    this_local._7_1_ = 0;
    new_info._0_4_ = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  if ((int)new_info == 0) {
    Impl::pump_synchronized_recording(this->impl,this);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateRecorder::record_pipeline_layout(VkPipelineLayout pipeline_layout, const VkPipelineLayoutCreateInfo &create_info,
                                           Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		if (create_info.pNext)
		{
			log_error_pnext_chain("pNext in VkPipelineLayoutCreateInfo not supported.", create_info.pNext);
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, pipeline_layout);
			return false;
		}

		VkPipelineLayoutCreateInfo *new_info = nullptr;
		if (!impl->copy_pipeline_layout(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, pipeline_layout);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, api_object_cast<uint64_t>(pipeline_layout),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}